

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  ushort uVar1;
  run_container_t *c;
  _Bool _Var2;
  array_container_t *paVar3;
  uint8_t uVar4;
  uint8_t type;
  int iVar5;
  run_container_t *run;
  uint i;
  uint uVar6;
  uint8_t local_31;
  run_container_t *local_30;
  
  iVar5 = x1_arr->size;
  if (((long)iVar5 == 0) || (x1_arr->keys[(long)iVar5 + -1] == hb)) {
    i = iVar5 - 1;
  }
  else {
    if (iVar5 < 1) {
      i = 0xffffffff;
      goto LAB_0010b09e;
    }
    iVar5 = iVar5 + -1;
    uVar6 = 0;
    do {
      i = iVar5 + uVar6 >> 1;
      uVar1 = *(ushort *)((long)x1_arr->keys + (ulong)(iVar5 + uVar6 & 0xfffffffe));
      if (uVar1 < hb) {
        uVar6 = i + 1;
      }
      else {
        if (uVar1 <= hb) goto LAB_0010af6d;
        iVar5 = i - 1;
      }
    } while ((int)uVar6 <= iVar5);
    i = ~uVar6;
  }
  if (-1 < (int)i) {
LAB_0010af6d:
    local_31 = x1_arr->typecodes[i & 0xffff];
    paVar3 = (array_container_t *)x1_arr->containers[i & 0xffff];
    if (local_31 == '\x04') {
      paVar3 = (array_container_t *)
               shared_container_extract_copy((shared_container_t *)paVar3,&local_31);
    }
    uVar6 = (uint)lb_start;
    iVar5 = lb_end + 1;
    local_30 = (run_container_t *)0x0;
    if (local_31 == '\x03') {
      iVar5 = run_container_negation_range_inplace((run_container_t *)paVar3,uVar6,iVar5,&local_30);
      uVar4 = (uint8_t)iVar5;
      run = local_30;
      type = uVar4;
      if (uVar4 == '\x04') {
        uVar4 = *(uint8_t *)&local_30->runs;
        run = *(run_container_t **)local_30;
        type = '\x04';
      }
    }
    else {
      if (local_31 == '\x02') {
        _Var2 = array_container_negation_range_inplace(paVar3,uVar6,iVar5,&local_30);
      }
      else {
        _Var2 = bitset_container_negation_range_inplace
                          ((bitset_container_t *)paVar3,uVar6,iVar5,&local_30);
      }
      uVar4 = '\x02' - _Var2;
      run = local_30;
      type = uVar4;
    }
    c = local_30;
    if (uVar4 == '\x03') {
      iVar5 = run_container_cardinality(run);
    }
    else {
      iVar5 = run->n_runs;
    }
    if (iVar5 == 0) {
      container_free(c,type);
      ra_remove_at_index(x1_arr,i);
    }
    else {
      x1_arr->containers[i] = c;
      x1_arr->typecodes[i] = type;
    }
    return;
  }
LAB_0010b09e:
  uVar6 = (uint)lb_start;
  iVar5 = lb_end - uVar6;
  if (iVar5 + 2U < 3) {
    paVar3 = array_container_create_range(uVar6,lb_end + 1);
    uVar4 = '\x02';
  }
  else {
    paVar3 = (array_container_t *)run_container_create_given_capacity(1);
    uVar4 = '\x03';
    if (paVar3 == (array_container_t *)0x0) {
      paVar3 = (array_container_t *)0x0;
    }
    else {
      *(uint *)(paVar3->array + (long)paVar3->cardinality * 2) = iVar5 * 0x10000 | uVar6;
      paVar3->cardinality = paVar3->cardinality + 1;
    }
  }
  ra_insert_new_key_value_at(x1_arr,~i,hb,paVar3,uVar4);
  return;
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}